

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImU32 *pIVar1;
  ImGuiItemStatusFlags *pIVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 IVar5;
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 IVar6;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImGuiContext *pIVar7;
  undefined8 text;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  ImU32 IVar11;
  ImGuiWindowTempData *pIVar12;
  byte bVar13;
  uint uVar14;
  ImGuiID IVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  bool held;
  bool hovered;
  float local_dc;
  ImRect local_d8;
  ImVec2 local_c8;
  float local_bc;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  char *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ImRect interact_bb;
  ImVec2 label_size;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  if ((flags & 0x402U) == 0) {
    fVar18 = (pIVar4->DC).CurrLineTextBaseOffset;
    fVar3 = (pIVar7->Style).FramePadding.y;
    if (fVar3 <= fVar18) {
      fVar18 = fVar3;
    }
  }
  else {
    fVar18 = (pIVar7->Style).FramePadding.y;
  }
  local_88 = ZEXT416((uint)fVar18);
  local_68 = ZEXT416((uint)(pIVar7->Style).FramePadding.x);
  if (label_end == (char *)0x0) {
    label_end = FindRenderedTextEnd(label,(char *)0x0);
  }
  local_90 = label_end;
  label_size = CalcTextSize(label,label_end,false,-1.0);
  pIVar12 = (ImGuiWindowTempData *)&pIVar4->WorkRect;
  if (((uint)flags >> 0xc & 1) == 0) {
    pIVar12 = &pIVar4->DC;
  }
  fVar18 = (pIVar4->DC).CurrLineSize.y;
  fVar3 = pIVar7->FontSize;
  fVar17 = (pIVar7->Style).FramePadding.y;
  fVar17 = fVar17 + fVar17 + fVar3;
  if (fVar17 <= fVar18) {
    fVar18 = fVar17;
  }
  fVar17 = (float)local_88._0_4_ + (float)local_88._0_4_ + label_size.y;
  uVar16 = -(uint)(fVar17 <= fVar18);
  interact_bb.Min.y = (float)(uVar16 & (uint)fVar18 | ~uVar16 & (uint)fVar17);
  local_d8.Min.x = (pIVar12->CursorPos).x;
  local_d8.Min.y = (pIVar4->DC).CursorPos.y;
  local_d8.Max.x = (pIVar4->WorkRect).Max.x;
  local_d8.Max.y = interact_bb.Min.y + local_d8.Min.y;
  if ((flags & 2U) == 0) {
    fVar18 = 2.0;
  }
  else {
    fVar18 = (pIVar4->WindowPadding).x * 0.5;
    local_d8.Min.x = local_d8.Min.x - (float)(int)(fVar18 + -1.0);
    local_d8.Max.x = local_d8.Max.x + (float)(int)fVar18;
    fVar18 = 3.0;
  }
  local_a8 = fVar18 * (float)local_68._0_4_ + fVar3;
  fVar18 = (pIVar4->DC).CurrLineTextBaseOffset;
  uVar16 = -(uint)(fVar18 <= (float)local_88._0_4_);
  local_bc = (float)local_68._0_4_ + (float)local_68._0_4_;
  interact_bb.Min.x = (float)(-(uint)(0.0 < label_size.x) & (uint)(local_bc + label_size.x)) + fVar3
  ;
  local_78 = ZEXT416((uint)local_a8);
  local_a8 = (pIVar4->DC).CursorPos.x + local_a8;
  fStack_a4 = (float)(~uVar16 & (uint)fVar18 | uVar16 & local_88._0_4_) + local_d8.Min.y;
  uStack_a0 = 0;
  local_c8.y = fStack_a4;
  local_c8.x = local_a8;
  _local_b8 = ZEXT416((uint)interact_bb.Min.x);
  local_dc = local_d8.Min.x;
  ItemSize(&interact_bb.Min,(float)local_88._0_4_);
  interact_bb.Min.y = local_d8.Min.y;
  interact_bb.Min.x = local_d8.Min.x;
  interact_bb.Max.x = local_d8.Max.x;
  if ((flags & 0x1802U) == 0) {
    fVar18 = (pIVar7->Style).ItemSpacing.x;
    interact_bb.Max.x = fVar18 + fVar18 + (float)local_b8._0_4_ + local_dc;
  }
  interact_bb.Max.y = local_d8.Max.y;
  bVar8 = TreeNodeBehaviorIsOpen(id,flags);
  if (((bVar8) && ((flags & 0x2008U) == 0x2000)) && (pIVar7->NavIdIsAlive == false)) {
    pIVar1 = &(pIVar4->DC).TreeJumpToParentOnPopMask;
    *pIVar1 = *pIVar1 | 1 << ((byte)(pIVar4->DC).TreeDepth & 0x1f);
  }
  bVar9 = ItemAdd(&interact_bb,id,(ImRect *)0x0,0);
  pIVar2 = &(pIVar7->LastItemData).StatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 2;
  IVar5.y = local_d8.Min.y;
  IVar5.x = local_d8.Min.x;
  IVar6.y = local_d8.Max.y;
  IVar6.x = local_d8.Max.x;
  (pIVar7->LastItemData).DisplayRect.Min = IVar5;
  (pIVar7->LastItemData).DisplayRect.Max = IVar6;
  if (!bVar9) {
    if (!bVar8 || (char)((flags & 8U) >> 3) != '\0') {
      return bVar8;
    }
    TreePushOverrideID(id);
    return true;
  }
  local_88._0_8_ = label;
  uVar14 = (flags & 4U) * 0x400;
  uVar16 = uVar14 + 0x200;
  if (((uint)flags >> 8 & 1) != 0) {
    uVar16 = uVar14;
  }
  local_b8._0_4_ = local_a8 - (float)local_78._0_4_;
  fVar18 = (pIVar7->Style).TouchExtraPadding.x;
  fVar3 = (pIVar7->IO).MousePos.x;
  if ((float)local_b8._0_4_ - fVar18 <= fVar3) {
    local_dc = (float)CONCAT31((int3)(uVar14 >> 8),
                               fVar3 < fVar18 + local_bc + pIVar7->FontSize + (float)local_b8._0_4_)
    ;
  }
  else {
    local_dc = 0.0;
  }
  local_b8._4_4_ = fStack_a4;
  uStack_b0 = (undefined4)uStack_a0;
  uStack_ac = uStack_a0._4_4_;
  if (SUB41(local_dc,0) == '\0') {
    if ((flags & 0x40U) == 0) {
      uVar14 = uVar16 | 0x10020;
    }
    else {
      uVar14 = uVar16 | 0x10120;
    }
  }
  else {
    uVar14 = uVar16 + 0x10000;
    if (pIVar4 == pIVar7->HoveredWindow) {
      uVar14 = uVar16;
    }
    uVar14 = uVar14 | 0x10;
  }
  bVar9 = ButtonBehavior(&interact_bb,id,&hovered,&held,uVar14);
  if (((uint)flags >> 8 & 1) != 0) goto LAB_0015991e;
  if (bVar9) {
    if (pIVar7->DragDropHoldJustPressedId == id) {
      bVar10 = !bVar8;
    }
    else {
      if (((flags & 0xc0U) == 0) || (pIVar7->NavActivateId == id)) {
        bVar10 = 1;
      }
      else {
        bVar10 = 0;
      }
      if ((char)flags < '\0') {
        bVar13 = 0;
        if (local_dc._0_1_ != '\0') {
          bVar13 = pIVar7->NavDisableMouseHover ^ 1;
        }
        bVar10 = bVar10 | bVar13;
      }
      if (((flags & 0x40U) != 0) && ((pIVar7->IO).MouseClickedCount[0] == 2)) {
        bVar10 = 1;
      }
    }
  }
  else {
    bVar10 = 0;
  }
  IVar15 = pIVar7->NavId;
  if (IVar15 == id) {
    if (bVar8 && pIVar7->NavMoveDir == 0) {
      NavMoveRequestCancel();
      IVar15 = pIVar7->NavId;
      bVar10 = 1;
      goto LAB_001598e1;
    }
LAB_001598e5:
    if (pIVar7->NavMoveDir != 1 || bVar8) goto LAB_001598f5;
    NavMoveRequestCancel();
  }
  else {
LAB_001598e1:
    if (IVar15 == id) goto LAB_001598e5;
LAB_001598f5:
    if (bVar10 == 0) goto LAB_0015991e;
  }
  bVar8 = !bVar8;
  ImGuiStorage::SetInt((pIVar4->DC).StateStorage,id,(uint)bVar8);
  pIVar2 = &(pIVar7->LastItemData).StatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 0x10;
LAB_0015991e:
  if ((flags & 4U) != 0) {
    SetItemAllowOverlap();
  }
  local_dc = (float)GetColorU32(0,1.0);
  if ((flags & 2U) == 0) {
    text = local_88._0_8_;
    if (((flags & 1U) == 0 & (hovered ^ 1U)) == 0) {
      uVar16 = 0x1a;
      if ((held & hovered) == 0) {
        uVar16 = hovered | 0x18;
      }
      IVar11 = GetColorU32(uVar16,1.0);
      p_min.y = local_d8.Min.y;
      p_min.x = local_d8.Min.x;
      p_max.y = local_d8.Max.y;
      p_max.x = local_d8.Max.x;
      RenderFrame(p_min,p_max,IVar11,false,0.0);
    }
    RenderNavHighlight(&local_d8,id,2);
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_02.y = pIVar7->FontSize * 0.15 + fStack_a4;
        pos_02.x = (float)local_68._0_4_ + (float)local_b8._0_4_;
        RenderArrow(pIVar4->DrawList,pos_02,(ImU32)local_dc,(uint)bVar8 * 2 + 1,0.7);
      }
    }
    else {
      pos_01.y = pIVar7->FontSize * 0.5 + fStack_a4;
      pos_01.x = -(float)local_78._0_4_ * 0.5 + local_a8;
      RenderBullet(pIVar4->DrawList,pos_01,(ImU32)local_dc);
    }
    if (pIVar7->LogEnabled == true) {
      LogSetNextTextDecoration(">",(char *)0x0);
    }
    RenderText(local_c8,(char *)text,local_90,false);
  }
  else {
    uVar14 = (held ^ 1U) & hovered | 0x18;
    uVar16 = 0x1a;
    if ((hovered & 1U) == 0) {
      uVar16 = uVar14;
    }
    if (held == false) {
      uVar16 = uVar14;
    }
    IVar11 = GetColorU32(uVar16,1.0);
    p_min_00.y = local_d8.Min.y;
    p_min_00.x = local_d8.Min.x;
    p_max_00.y = local_d8.Max.y;
    p_max_00.x = local_d8.Max.x;
    RenderFrame(p_min_00,p_max_00,IVar11,true,(pIVar7->Style).FrameRounding);
    RenderNavHighlight(&local_d8,id,2);
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_00.y = fStack_a4;
        pos_00.x = (float)local_68._0_4_ + (float)local_b8._0_4_;
        RenderArrow(pIVar4->DrawList,pos_00,(ImU32)local_dc,(uint)bVar8 * 2 + 1,1.0);
      }
      else {
        local_c8.x = (float)local_b8._0_4_;
      }
    }
    else {
      pos.y = pIVar7->FontSize * 0.5 + fStack_a4;
      pos.x = -(float)local_78._0_4_ * 0.6 + local_a8;
      RenderBullet(pIVar4->DrawList,pos,(ImU32)local_dc);
    }
    if (((uint)flags >> 0x14 & 1) != 0) {
      local_d8.Max.x = local_d8.Max.x - (pIVar7->FontSize + (pIVar7->Style).FramePadding.x);
    }
    if (pIVar7->LogEnabled == true) {
      LogSetNextTextDecoration("###","###");
    }
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClipped(&local_c8,&local_d8.Max,(char *)local_88._0_8_,local_90,&label_size,&local_38,
                      (ImRect *)0x0);
  }
  if (bVar8 == true && (char)((flags & 8U) >> 3) == '\0') {
    TreePushOverrideID(id);
  }
  return bVar8;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}